

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregoimp.cpp
# Opt level: O0

double icu_63::Grego::fieldsToDay(int32_t year,int32_t month,int32_t dom)

{
  UBool UVar1;
  int numerator;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  double julian;
  int32_t y;
  int32_t dom_local;
  int32_t month_local;
  int32_t year_local;
  
  numerator = year + -1;
  iVar2 = ClockMath::floorDivide(numerator,4);
  iVar3 = ClockMath::floorDivide(numerator,400);
  iVar4 = ClockMath::floorDivide(numerator,100);
  UVar1 = isLeapYear(year);
  iVar5 = 0;
  if (UVar1 != '\0') {
    iVar5 = 0xc;
  }
  return (double)(((numerator * 0x16d + iVar2 + iVar3) - iVar4) + 0x1a4451 +
                  (int)*(short *)(DAYS_BEFORE + (long)(month + iVar5) * 2) + dom) - 2440588.0;
}

Assistant:

double Grego::fieldsToDay(int32_t year, int32_t month, int32_t dom) {

    int32_t y = year - 1;

    double julian = 365 * y + ClockMath::floorDivide(y, 4) + (JULIAN_1_CE - 3) + // Julian cal
        ClockMath::floorDivide(y, 400) - ClockMath::floorDivide(y, 100) + 2 + // => Gregorian cal
        DAYS_BEFORE[month + (isLeapYear(year) ? 12 : 0)] + dom; // => month/dom

    return julian - JULIAN_1970_CE; // JD => epoch day
}